

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest::Run
          (CommandLineInterfaceTest *this,string *command)

{
  string_view command_00;
  undefined1 local_a0 [48];
  long *local_70;
  size_t local_68;
  long local_60 [2];
  AlphaNum local_50;
  
  if (this->disallow_plugins_ == false) {
    local_a0._0_8_ = local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"prefix-","");
    CommandLineInterface::AllowPlugins
              (&(this->super_CommandLineInterfaceTester).cli_,(string *)local_a0);
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    local_a0._0_8_ = (pointer)0x1;
    local_a0._8_8_ = " ";
    compiler::(anonymous_namespace)::CreatePluginArg_abi_cxx11_();
    local_50.piece_._M_len = local_68;
    local_50.piece_._M_str = (char *)local_70;
    absl::lts_20250127::StrAppend(command,(AlphaNum *)local_a0,&local_50);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  command_00._M_str = (command->_M_dataplus)._M_p;
  command_00._M_len = command->_M_string_length;
  CommandLineInterfaceTester::RunProtoc(&this->super_CommandLineInterfaceTester,command_00);
  return;
}

Assistant:

void CommandLineInterfaceTest::Run(std::string command) {
  if (!disallow_plugins_) {
    AllowPlugins("prefix-");
    absl::StrAppend(&command, " ", CreatePluginArg());
  }

  RunProtoc(command);
}